

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O2

void key_tests::CmpSerializationPubkey(CPubKey *pubkey)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_f0;
  char *local_e8;
  lazy_ostream local_e0;
  undefined1 *local_d0;
  char **local_c8;
  assertion_result local_c0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  DataStream local_88;
  CPubKey pubkey2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_read_pos = 0;
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CPubKey::Serialize<DataStream>(pubkey,&local_88);
  pubkey2.vch[0] = 0xff;
  CPubKey::Unserialize<DataStream>(&pubkey2,&local_88);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xeb;
  file.m_begin = (iterator)&local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==(pubkey,&pubkey2);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8 = &local_f0;
  local_f0 = "pubkey == pubkey2";
  local_e8 = "";
  local_e0.m_empty = false;
  local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_e0,1,0,WARN,0xb9add4,(size_t)&stack0xffffffffffffff00,0xeb);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CmpSerializationPubkey(const CPubKey& pubkey)
{
    DataStream stream{};
    stream << pubkey;
    CPubKey pubkey2;
    stream >> pubkey2;
    BOOST_CHECK(pubkey == pubkey2);
}